

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

int __thiscall Pathie::Path::rename(Path *this,char *__old,char *__new)

{
  int iVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ErrnoError *this_00;
  int *piVar3;
  string newname_nstr;
  string nstr;
  string local_50;
  string local_30;
  
  utf8_to_filename(&local_30,&this->m_path);
  utf8_to_filename(&local_50,(string *)__old);
  iVar1 = ::rename(local_30._M_dataplus._M_p,local_50._M_dataplus._M_p);
  if (iVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    paVar2 = &local_30.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar2) {
      operator_delete(local_30._M_dataplus._M_p);
      paVar2 = extraout_RAX;
    }
    return (int)paVar2;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar3 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar3);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void Path::rename(Path& newname) const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();
  std::string newname_nstr = newname.native();

  if (::rename(nstr.c_str(), newname_nstr.c_str()) != 0)
    throw Pathie::ErrnoError(errno);
#elif defined(_WIN32)
  std::wstring utf16_oldname = utf8_to_utf16(m_path);
  std::wstring utf16_newname = utf8_to_utf16(newname.m_path);

  if (_wrename(utf16_oldname.c_str(), utf16_newname.c_str()) != 0)
    throw Pathie::ErrnoError(errno);
#else
#error Unsupported system.
#endif
}